

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

DdGen * Cudd_FirstPrime(DdManager *dd,DdNode *l,DdNode *u,int **cube)

{
  int *piVar1;
  int iVar2;
  DdGen *__ptr;
  int *piVar3;
  DdNode *pDVar4;
  DdNode *cube_00;
  int length;
  
  if (u != (DdNode *)0x0 && (l != (DdNode *)0x0 && dd != (DdManager *)0x0)) {
    __ptr = (DdGen *)malloc(0x38);
    if (__ptr == (DdGen *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      __ptr->manager = dd;
      __ptr->type = 1;
      __ptr->status = 0;
      (__ptr->gen).primes.ub = u;
      (__ptr->stack).sp = 0;
      (__ptr->stack).stack = (DdNode **)0x0;
      __ptr->node = l;
      piVar3 = (int *)(((ulong)l & 0xfffffffffffffffe) + 4);
      *piVar3 = *piVar3 + 1;
      piVar3 = (int *)malloc((long)dd->size << 2);
      (__ptr->gen).cubes.cube = piVar3;
      if (piVar3 == (int *)0x0) {
        dd->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        pDVar4 = Cudd_ReadLogicZero(dd);
        if (pDVar4 == l) {
          iVar2 = 0;
LAB_0067129b:
          __ptr->status = iVar2;
          *cube = piVar3;
          return __ptr;
        }
        pDVar4 = Cudd_LargestCube(dd,l,&length);
        if (pDVar4 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          cube_00 = Cudd_bddMakePrime(dd,pDVar4,u);
          if (cube_00 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,l);
            l = pDVar4;
          }
          else {
            piVar1 = (int *)(((ulong)cube_00 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,pDVar4);
            pDVar4 = Cudd_bddAnd(dd,l,(DdNode *)((ulong)cube_00 ^ 1));
            if (pDVar4 != (DdNode *)0x0) {
              piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              Cudd_RecursiveDeref(dd,l);
              __ptr->node = pDVar4;
              iVar2 = Cudd_BddToCubeArray(dd,cube_00,piVar3);
              l = pDVar4;
              if (iVar2 != 0) {
                Cudd_RecursiveDeref(dd,cube_00);
                iVar2 = 1;
                goto LAB_0067129b;
              }
            }
            Cudd_RecursiveDeref(dd,l);
            l = cube_00;
          }
        }
        Cudd_RecursiveDeref(dd,l);
        free(piVar3);
      }
      free(__ptr);
    }
  }
  return (DdGen *)0x0;
}

Assistant:

DdGen *
Cudd_FirstPrime(
  DdManager *dd,
  DdNode *l,
  DdNode *u,
  int **cube)
{
    DdGen *gen;
    DdNode *implicant, *prime, *tmp;
    int length, result;

    /* Sanity Check. */
    if (dd == NULL || l == NULL || u == NULL) return(NULL);

    /* Allocate generator an initialize it. */
    gen = ABC_ALLOC(DdGen,1);
    if (gen == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    gen->manager = dd;
    gen->type = CUDD_GEN_PRIMES;
    gen->status = CUDD_GEN_EMPTY;
    gen->gen.primes.cube = NULL;
    gen->gen.primes.ub = u;
    gen->stack.sp = 0;
    gen->stack.stack = NULL;
    gen->node = l;
    cuddRef(l);

    gen->gen.primes.cube = ABC_ALLOC(int,dd->size);
    if (gen->gen.primes.cube == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen);
        return(NULL);
    }

    if (gen->node == Cudd_ReadLogicZero(dd)) {
        gen->status = CUDD_GEN_EMPTY;
    } else {
        implicant = Cudd_LargestCube(dd,gen->node,&length);
        if (implicant == NULL) {
            Cudd_RecursiveDeref(dd,gen->node);
            ABC_FREE(gen->gen.primes.cube);
            ABC_FREE(gen);
            return(NULL);
        }
        cuddRef(implicant);
        prime = Cudd_bddMakePrime(dd,implicant,gen->gen.primes.ub);
        if (prime == NULL) {
            Cudd_RecursiveDeref(dd,gen->node);
            Cudd_RecursiveDeref(dd,implicant);
            ABC_FREE(gen->gen.primes.cube);
            ABC_FREE(gen);
            return(NULL);
        }
        cuddRef(prime);
        Cudd_RecursiveDeref(dd,implicant);
        tmp = Cudd_bddAnd(dd,gen->node,Cudd_Not(prime));
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,gen->node);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(gen->gen.primes.cube);
            ABC_FREE(gen);
            return(NULL);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,gen->node);
        gen->node = tmp;
        result = Cudd_BddToCubeArray(dd,prime,gen->gen.primes.cube);
        if (result == 0) {
            Cudd_RecursiveDeref(dd,gen->node);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(gen->gen.primes.cube);
            ABC_FREE(gen);
            return(NULL);
        }
        Cudd_RecursiveDeref(dd,prime);
        gen->status = CUDD_GEN_NONEMPTY;
    }
    *cube = gen->gen.primes.cube;
    return(gen);

}